

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_string(void)

{
  byte bVar1;
  XMLCh *pXVar2;
  char *pcVar3;
  XSValue *pXVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  void *pvVar8;
  bool bVar9;
  StrX local_f8;
  StrX local_e8;
  StrX local_d8;
  long local_c8;
  XMLCh *actRetCanRep;
  Status myStatus_2;
  int j;
  StrX local_a8;
  StrX local_98;
  XSValue *local_88;
  XSValue *actRetValue;
  Status myStatus_1;
  int i;
  StrX local_58;
  byte local_45;
  Status local_44;
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_1;
  char v_1 [9];
  bool toValidate;
  DataType dt;
  
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 1.693756104804884e+190;
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  local_44 = st_Init;
  StrX::StrX(&local_58,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar2 = StrX::unicodeForm(&local_58);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar2,dt_string,&local_44,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_58);
  local_45 = bVar1 & 1;
  if (local_45 != 1) {
    pXVar2 = getDataTypeString(dt_string);
    StrX::StrX((StrX *)&myStatus_1,pXVar2);
    pcVar3 = StrX::localForm((StrX *)&myStatus_1);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x132e,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar3,1);
    StrX::~StrX((StrX *)&myStatus_1);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar9 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = st_Init;
    StrX::StrX(&local_98,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar2 = StrX::unicodeForm(&local_98);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar2,dt_string,(Status *)&actRetValue,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_98);
    local_88 = pXVar4;
    if (pXVar4 == (XSValue *)0x0) {
      if ((Status)actRetValue != st_NoActVal) {
        pXVar2 = getDataTypeString(dt_string);
        StrX::StrX((StrX *)&myStatus_2,pXVar2);
        pcVar3 = StrX::localForm((StrX *)&myStatus_2);
        pcVar5 = getStatusString(st_NoActVal);
        pcVar6 = getStatusString((Status)actRetValue);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x134a,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar3,pcVar5,pcVar6);
        StrX::~StrX((StrX *)&myStatus_2);
        errSeen = true;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt_string);
      StrX::StrX(&local_a8,pXVar2);
      StrX::localForm(&local_a8);
      pvVar8 = (void *)0x134a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x134a,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_a8);
      pXVar4 = local_88;
      errSeen = true;
      if (local_88 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_88);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar8);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar9 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_d8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar2 = StrX::unicodeForm(&local_d8);
    lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar2,dt_string,(Status *)&actRetCanRep,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_d8);
    local_c8 = lVar7;
    if (lVar7 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar2 = getDataTypeString(dt_string);
        StrX::StrX(&local_f8,pXVar2);
        pcVar3 = StrX::localForm(&local_f8);
        pcVar5 = getStatusString(st_NoCanRep);
        pcVar6 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1368,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar3,pcVar5,pcVar6);
        StrX::~StrX(&local_f8);
        errSeen = true;
      }
    }
    else {
      pXVar2 = getDataTypeString(dt_string);
      StrX::StrX(&local_e8,pXVar2);
      StrX::localForm(&local_e8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1368,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_e8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_c8);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_string()
{
    const XSValue::DataType dt = XSValue::dt_string;
    bool  toValidate = true;

    const char v_1[]="mystring";
    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                     n/a             false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             n/a
     *   invalid                      n/a                  0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             n/a
     *   invalid                      n/a                  0             st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);

        //  invalid
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              n/a
     *   invalid                       n/a                0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              n/a
     *   invalid                       n/a                0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid

    }

}